

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Poly.cpp
# Opt level: O3

void __thiscall chrono::ChFunction_Poly::ArchiveOUT(ChFunction_Poly *this,ChArchiveOut *marchive)

{
  ChNameValue<double[6]> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Poly>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  local_38._value = &this->coeff;
  local_38._name = "coeff";
  local_38._flags = '\0';
  ChArchiveOut::out<double,6ul>(marchive,&local_38);
  local_38._value = (double (*) [6])&this->order;
  local_38._name = "order";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive,&local_38);
  return;
}

Assistant:

void ChFunction_Poly::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Poly>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(coeff);
    marchive << CHNVP(order);
}